

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArduinoPressureSensor.h
# Opt level: O2

char * FindArduinoPressureSensorSentence(char *sentencebegin,char *str)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  
  pcVar1 = strstr(str,sentencebegin);
  if (pcVar1 == (char *)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    sVar2 = strlen(sentencebegin);
    pcVar3 = strstr(pcVar1 + sVar2,"\r\n");
    if (pcVar3 == (char *)0x0) {
      pcVar1 = (char *)0x0;
    }
  }
  return pcVar1;
}

Assistant:

inline char* FindArduinoPressureSensorSentence(char* sentencebegin, char* str)
{
	char* ptr = NULL;
	char* foundstr = NULL;

	ptr = strstr(str, sentencebegin);
	if (!ptr)
	{
		// Could not find the beginning of the sentence.
		return NULL;
	}

	// Save the position of the beginning of the sentence.
	foundstr = ptr;

	// Check if the sentence is complete.
	ptr = strstr(foundstr+strlen(sentencebegin), "\r\n");
	if (!ptr)
	{
		// The sentence is incomplete.
		return NULL;
	}

	return foundstr;
}